

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

bool caffe::UpgradeV0Net(NetParameter *v0_net_param_padding_layers,NetParameter *net_param)

{
  bool bVar1;
  int32 value;
  Type *v0_layer_connection;
  V1LayerParameter *layer_param;
  Type *value_00;
  bool bVar2;
  int i;
  int iVar3;
  int i_1;
  NetParameter v0_net_param;
  NetParameter local_d0;
  
  NetParameter::NetParameter(&local_d0);
  UpgradeV0PaddingLayers(v0_net_param_padding_layers,&local_d0);
  NetParameter::Clear(net_param);
  if (((byte)local_d0._has_bits_.has_bits_[0] & 1) != 0) {
    NetParameter::set_name(net_param,local_d0.name_.ptr_);
  }
  bVar2 = true;
  for (iVar3 = 0; iVar3 < local_d0.layers_.super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    v0_layer_connection =
         google::protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                   (&local_d0.layers_.super_RepeatedPtrFieldBase,iVar3);
    layer_param = google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::Add
                            (&net_param->layers_);
    bVar1 = UpgradeV0LayerParameter(v0_layer_connection,layer_param);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  for (iVar3 = 0; iVar3 < local_d0.input_.super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&local_d0.input_.super_RepeatedPtrFieldBase,iVar3);
    NetParameter::add_input(net_param,value_00);
  }
  for (iVar3 = 0; iVar3 < local_d0.input_dim_.current_size_; iVar3 = iVar3 + 1) {
    value = NetParameter::input_dim(&local_d0,iVar3);
    NetParameter::add_input_dim(net_param,value);
  }
  if (((byte)local_d0._has_bits_.has_bits_[0] & 4) != 0) {
    (net_param->_has_bits_).has_bits_[0] = (net_param->_has_bits_).has_bits_[0] | 4;
    net_param->force_backward_ = local_d0.force_backward_;
  }
  NetParameter::~NetParameter(&local_d0);
  return bVar2;
}

Assistant:

bool UpgradeV0Net(const NetParameter& v0_net_param_padding_layers,
                  NetParameter* net_param) {
  // First upgrade padding layers to padded conv layers.
  NetParameter v0_net_param;
  UpgradeV0PaddingLayers(v0_net_param_padding_layers, &v0_net_param);
  // Now upgrade layer parameters.
  bool is_fully_compatible = true;
  net_param->Clear();
  if (v0_net_param.has_name()) {
    net_param->set_name(v0_net_param.name());
  }
  for (int i = 0; i < v0_net_param.layers_size(); ++i) {
    is_fully_compatible &= UpgradeV0LayerParameter(v0_net_param.layers(i),
                                                   net_param->add_layers());
  }
  for (int i = 0; i < v0_net_param.input_size(); ++i) {
    net_param->add_input(v0_net_param.input(i));
  }
  for (int i = 0; i < v0_net_param.input_dim_size(); ++i) {
    net_param->add_input_dim(v0_net_param.input_dim(i));
  }
  if (v0_net_param.has_force_backward()) {
    net_param->set_force_backward(v0_net_param.force_backward());
  }
  return is_fully_compatible;
}